

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O1

Color __thiscall
PlasticBSDF::sample_f
          (PlasticBSDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,bool *isDirac,
          Sampler *sampler)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  float fVar4;
  float fVar5;
  Color CVar6;
  
  fVar3 = ABS(wo->z);
  fVar4 = 1.0 - fVar3 * fVar3;
  if (fVar4 <= 0.0) {
    fVar4 = 0.0;
  }
  fVar1 = *(float *)&(this->super_BSDF).field_0x24;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar5 = 1.0;
  fVar4 = fVar4 / fVar1;
  if (fVar4 < 1.0) {
    fVar4 = 1.0 - fVar4 * fVar4;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar5 = (fVar1 * fVar3 - fVar4) / (fVar1 * fVar3 + fVar4);
    fVar4 = (fVar3 - fVar1 * fVar4) / (fVar1 * fVar4 + fVar3);
    fVar5 = (fVar4 * fVar4 + fVar5 * fVar5) * 0.5;
  }
  (**sampler->_vptr_Sampler)(sampler);
  if (fVar5 <= extraout_XMM0_Da) {
    *isDirac = false;
    fVar4 = fVar5;
    (*sampler->_vptr_Sampler[6])(sampler);
    wi->x = (float)extraout_XMM0_Da_00;
    wi->y = (float)extraout_XMM0_Db;
    wi->z = fVar4;
    *pdf = ((1.0 - fVar5) * fVar4) / PI;
    if (wo->z <= 0.0 && wo->z != 0.0) {
      wi->z = -wi->z;
    }
    CVar6 = f(this,albedo,wo,wi);
    fVar3 = CVar6.z;
    fVar5 = CVar6.x;
    fVar4 = CVar6.y;
  }
  else {
    *pdf = fVar5;
    *isDirac = true;
    fVar4 = wo->z;
    uVar2._0_4_ = wo->x;
    uVar2._4_4_ = wo->y;
    wi->x = (float)(int)(uVar2 ^ 0x8000000080000000);
    wi->y = (float)(int)((uVar2 ^ 0x8000000080000000) >> 0x20);
    wi->z = fVar4;
    fVar5 = fVar5 / ABS(fVar4);
    fVar4 = fVar5;
    fVar3 = fVar5;
  }
  CVar6.y = fVar4;
  CVar6.x = fVar5;
  CVar6.z = fVar3;
  return CVar6;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, bool& isDirac, Sampler& sampler) const
	{
		float r = DielectricBRDF::reflectivity(fabs(wo.z), IOR);
		// specular reflection
		if (sampler.get1f() < r) {
			pdf = r;
			isDirac = true;
			wi = vec3f(-wo.x, -wo.y, wo.z);
			return r / fabs(wi.z);
		}
		// diffuse reflection
		isDirac = false;
		// wi from inner surface
		wi = sampler.cosSampleHemisphereSurface();
		pdf = (1-r) * wi.z / PI;
		if (wo.z<0) wi.z *= -1;
		return f(albedo, wo, wi);
		// wi = sampler.cosSampleHemisphereSurface();
		// pdf = wi.z/PI;
		// if (wo.z<0) wi.z *= -1;
		// return f(wo, wi);
		// // diffuse component only !!!!!!!
	}